

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O0

int event_base_get_npriorities(event_base *base)

{
  int iVar1;
  event_base *peStack_10;
  int n;
  event_base *base_local;
  
  peStack_10 = base;
  if (base == (event_base *)0x0) {
    peStack_10 = event_global_current_base_;
  }
  if (peStack_10->th_base_lock != (void *)0x0) {
    (*evthread_lock_fns_.lock)(0,peStack_10->th_base_lock);
  }
  iVar1 = peStack_10->nactivequeues;
  if (peStack_10->th_base_lock != (void *)0x0) {
    (*evthread_lock_fns_.unlock)(0,peStack_10->th_base_lock);
  }
  return iVar1;
}

Assistant:

int
event_base_get_npriorities(struct event_base *base)
{

	int n;
	if (base == NULL)
		base = current_base;

	EVBASE_ACQUIRE_LOCK(base, th_base_lock);
	n = base->nactivequeues;
	EVBASE_RELEASE_LOCK(base, th_base_lock);
	return (n);
}